

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

int ON_GetSpanIndices(int order,int cv_count,double *knot,int *span_indices)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int span_index;
  
  uVar3 = 0;
  iVar2 = -1;
  span_index = 0;
  while( true ) {
    if (iVar2 == span_index) {
      span_indices[uVar3 & 0xffffffff] = order + iVar2 + -1;
      return (int)uVar3;
    }
    span_indices[uVar3] = order + -2 + span_index;
    iVar1 = ON_NextNurbsSpanIndex(order,cv_count,knot,span_index);
    if (iVar1 < 0) break;
    uVar3 = uVar3 + 1;
    iVar2 = span_index;
    span_index = iVar1;
  }
  return -1;
}

Assistant:

int ON_GetSpanIndices(int order, 
                            int cv_count, 
                            const double* knot, 
                            int* span_indices)

/* span_indices should have size greater than the number of 
   spans (cv_count is big enough).

  returns span count.
  fills in span_indices with index of last in each bunch of multiple knots at 
  start of span, and first in buch at end of nurb.


  */
{
  int span_index, next_span_index, j;

  span_index = -1;
  next_span_index = 0;
  j = 0;
  while (span_index != next_span_index) {
    span_index = next_span_index;
    span_indices[j] = span_index + order - 2;
    next_span_index = ON_NextNurbsSpanIndex(order, cv_count, knot, span_index);
    if (next_span_index < 0) 
      return next_span_index;
    j++;
  } 
  
  span_indices[j] = span_index + order - 1;

  return j;
}